

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Ptr<Catch::IStreamingReporter> __thiscall
Catch::addReporter(Catch *this,Ptr<Catch::IStreamingReporter> *existingReporter,
                  Ptr<Catch::IStreamingReporter> *additionalReporter)

{
  int iVar1;
  IStreamingReporter *in_RAX;
  undefined4 extraout_var;
  IStreamingReporter *pIVar2;
  Ptr<Catch::IStreamingReporter> local_28;
  
  *(undefined8 *)this = 0;
  if (existingReporter->m_p == (IStreamingReporter *)0x0) {
    Ptr<Catch::IStreamingReporter>::operator=
              ((Ptr<Catch::IStreamingReporter> *)this,additionalReporter);
  }
  else {
    local_28.m_p = in_RAX;
    iVar1 = (*(existingReporter->m_p->super_IShared).super_NonCopyable._vptr_NonCopyable[0x11])();
    pIVar2 = (IStreamingReporter *)CONCAT44(extraout_var,iVar1);
    if (pIVar2 == (IStreamingReporter *)0x0) {
      pIVar2 = (IStreamingReporter *)operator_new(0x28);
      (pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable =
           (_func_int **)&PTR__MultipleReporters_001865a0;
      pIVar2[2].super_IShared.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
      pIVar2[3].super_IShared.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
      pIVar2[4].super_IShared.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
      *(undefined4 *)&pIVar2[1].super_IShared.super_NonCopyable._vptr_NonCopyable = 1;
      local_28.m_p = pIVar2;
      Ptr<Catch::IStreamingReporter>::operator=((Ptr<Catch::IStreamingReporter> *)this,&local_28);
      if (local_28.m_p != (IStreamingReporter *)0x0) {
        (*((local_28.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
      }
      if (existingReporter->m_p != (IStreamingReporter *)0x0) {
        std::
        vector<Catch::Ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Ptr<Catch::IStreamingReporter>_>_>
        ::push_back((vector<Catch::Ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Ptr<Catch::IStreamingReporter>_>_>
                     *)(pIVar2 + 2),existingReporter);
      }
    }
    else {
      Ptr<Catch::IStreamingReporter>::operator=
                ((Ptr<Catch::IStreamingReporter> *)this,existingReporter);
    }
    std::
    vector<Catch::Ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Ptr<Catch::IStreamingReporter>_>_>
    ::push_back((vector<Catch::Ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Ptr<Catch::IStreamingReporter>_>_>
                 *)(pIVar2 + 2),additionalReporter);
  }
  return (Ptr<Catch::IStreamingReporter>)(IStreamingReporter *)this;
}

Assistant:

Ptr<IStreamingReporter> addReporter( Ptr<IStreamingReporter> const& existingReporter, Ptr<IStreamingReporter> const& additionalReporter ) {
    Ptr<IStreamingReporter> resultingReporter;

    if( existingReporter ) {
        MultipleReporters* multi = existingReporter->tryAsMulti();
        if( !multi ) {
            multi = new MultipleReporters;
            resultingReporter = Ptr<IStreamingReporter>( multi );
            if( existingReporter )
                multi->add( existingReporter );
        }
        else
            resultingReporter = existingReporter;
        multi->add( additionalReporter );
    }
    else
        resultingReporter = additionalReporter;

    return resultingReporter;
}